

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase230::run(TestCase230 *this)

{
  bool bVar1;
  ElementCount index;
  Builder type;
  Builder field;
  Builder root;
  SchemaLoader loader;
  Builder fields;
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition;
  MallocMessageBuilder schemaBuilder;
  StructBuilder local_870;
  StructBuilder local_848;
  PointerBuilder local_818;
  StructReader local_7f8;
  SchemaLoader local_7c0;
  Reader local_798 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> local_608;
  MallocMessageBuilder local_450;
  Maybe<kj::Exception> local_360;
  Maybe<kj::Exception> local_1c8;
  
  SchemaLoader::SchemaLoader(&local_7c0);
  SchemaLoader::loadNative(&local_7c0,(RawSchema *)schemas::s_a851ad32cbc2ffea);
  MallocMessageBuilder::MallocMessageBuilder(&local_450,0x400,GROW_HEURISTICALLY);
  local_818.segment = (SegmentBuilder *)(schemas::s_a0a8f314b80b63fd + 0x48);
  Schema::getProto(local_798,(Schema *)&local_818);
  MessageBuilder::getRootInternal((Builder *)&local_870,&local_450.super_MessageBuilder);
  local_7f8.pointers =
       (WirePointer *)
       CONCAT44(local_798[0]._reader.pointers._4_4_,(ElementCount)local_798[0]._reader.pointers);
  local_7f8.dataSize = local_798[0]._reader.dataSize;
  local_7f8.pointerCount = local_798[0]._reader.pointerCount;
  local_7f8._38_2_ = local_798[0]._reader._38_2_;
  local_7f8.nestingLimit = local_798[0]._reader.nestingLimit;
  local_7f8._44_4_ = local_798[0]._reader._44_4_;
  local_7f8.data = local_798[0]._reader.data;
  local_7f8.segment = local_798[0]._reader.segment;
  local_7f8.capTable = local_798[0]._reader.capTable;
  local_848.data = local_870.data;
  local_848.segment = local_870.segment;
  local_848.capTable = local_870.capTable;
  PointerBuilder::setStruct((PointerBuilder *)&local_848,&local_7f8,false);
  MessageBuilder::getRootInternal((Builder *)&local_870,&local_450.super_MessageBuilder);
  local_848.data = local_870.data;
  local_848.segment = local_870.segment;
  local_848.capTable = local_870.capTable;
  PointerBuilder::getStruct
            ((StructBuilder *)&local_7f8,(PointerBuilder *)&local_848,(StructSize)0x60006,
             (word *)0x0);
  *(undefined8 *)local_7f8.data = 0xa851ad32cbc2ffea;
  if (*(short *)((long)local_7f8.data + 0xc) == 1) {
    local_848.data = local_7f8.pointers + 3;
    local_848.segment = (SegmentBuilder *)local_7f8.segment;
    local_848.capTable = (CapTableBuilder *)local_7f8.capTable;
    PointerBuilder::getStructList
              ((ListBuilder *)local_798,(PointerBuilder *)&local_848,(StructSize)0x40003,(word *)0x0
              );
    if ((ElementCount)local_798[0]._reader.pointers != 0) {
      index = 0;
      do {
        ListBuilder::getStructElement(&local_848,(ListBuilder *)local_798,index);
        if ((short)(((WirePointer *)((long)local_848.data + 8))->offsetAndKind).value == 0) {
          local_818.pointer = local_848.pointers + 2;
          local_818.segment = local_848.segment;
          local_818.capTable = local_848.capTable;
          PointerBuilder::getStruct(&local_870,&local_818,(StructSize)0x10003,(word *)0x0);
          if (((short)((WireValue<uint32_t>_conflict *)local_870.data)->value == 0x10) &&
             (*(WirePointer *)((long)local_870.data + 8) == (WirePointer)0xa0a8f314b80b63fd)) {
            ((WirePointer *)((long)local_870.data + 8))->offsetAndKind = 0xcbc2ffea;
            ((WirePointer *)((long)local_870.data + 8))->field_1 =
                 (anon_union_4_5_35ddcec3_for_WirePointer_1)0xa851ad32;
          }
        }
        index = index + 1;
      } while ((ElementCount)local_798[0]._reader.pointers != index);
    }
  }
  StructBuilder::asReader((StructBuilder *)&local_7f8);
  SchemaLoader::load(&local_7c0,local_798);
  MallocMessageBuilder::~MallocMessageBuilder(&local_450);
  local_360.ptr.isSet = false;
  kj::Maybe<kj::Exception>::Maybe(&local_1c8,&local_360);
  bVar1 = local_1c8.ptr.isSet;
  kj::Maybe<kj::Exception>::Maybe(&local_608.left,&local_1c8);
  local_608.right = (None *)&kj::none;
  local_608.op.content.ptr = " != ";
  local_608.op.content.size_ = 5;
  local_608.result = bVar1;
  if (local_1c8.ptr.isSet == true) {
    kj::Exception::~Exception(&local_1c8.ptr.field_1.value);
  }
  if (local_360.ptr.isSet == true) {
    kj::Exception::~Exception(&local_360.ptr.field_1.value);
  }
  if ((local_608.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[154],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0xea,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { loadUnderAlternateTypeId<test::TestAllTypes>(loader, typeId<test::TestListDefaults>()); }) != kj::none\", _kjCondition"
               ,(char (*) [154])
                "failed: expected kj::runCatchingExceptions([&]() { loadUnderAlternateTypeId<test::TestAllTypes>(loader, typeId<test::TestListDefaults>()); }) != kj::none"
               ,&local_608);
  }
  if (local_608.left.ptr.isSet == true) {
    kj::Exception::~Exception(&local_608.left.ptr.field_1.value);
  }
  SchemaLoader::~SchemaLoader(&local_7c0);
  return;
}

Assistant:

TEST(SchemaLoader, Incompatible) {
  SchemaLoader loader;
  loader.loadCompiledTypeAndDependencies<test::TestListDefaults>();
  EXPECT_NONFATAL_FAILURE(
      loadUnderAlternateTypeId<test::TestAllTypes>(loader, typeId<test::TestListDefaults>()));
}